

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chrono-test.cc
# Opt level: O0

string * format_tm_abi_cxx11_(tm *time,char *spec,locale *loc)

{
  long lVar1;
  size_t sVar2;
  locale *in_RCX;
  char *in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  ostringstream os;
  time_put<char,_std::ostreambuf_iterator<char,_std::char_traits<char>_>_> *facet;
  ostream_type *in_stack_fffffffffffffde8;
  ostreambuf_iterator<char,_std::char_traits<char>_> *poVar3;
  undefined8 local_1c8;
  undefined4 local_1c0;
  locale local_1a8 [8];
  long local_1a0 [47];
  ostreambuf_iterator<char,_std::char_traits<char>_> *local_28;
  char *local_18;
  undefined8 local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_28 = (ostreambuf_iterator<char,_std::char_traits<char>_> *)
             std::
             use_facet<std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>>
                       (in_RCX);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::ios::imbue(local_1a8);
  std::locale::~locale(local_1a8);
  poVar3 = local_28;
  std::ostreambuf_iterator<char,_std::char_traits<char>_>::ostreambuf_iterator
            (local_28,in_stack_fffffffffffffde8);
  lVar1 = *(long *)(local_1a0[0] + -0x18);
  sVar2 = strlen(local_18);
  std::time_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::put
            (poVar3,local_1c8,local_1c0,(long)local_1a0 + lVar1,0x20,local_10,local_18,
             local_18 + sVar2);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  return in_RDI;
}

Assistant:

std::string format_tm(const std::tm &time, const char *spec,
                      const std::locale &loc) {
  auto &facet = std::use_facet<std::time_put<char>>(loc);
  std::ostringstream os;
  os.imbue(loc);
  facet.put(os, os, ' ', &time, spec, spec + std::strlen(spec));
  return os.str();
}